

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

bool __thiscall ON_Brep::Transform(ON_Brep *this,ON_Xform *xform)

{
  ON_Surface *this_00;
  undefined1 auVar1 [16];
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ON_Curve **ppOVar8;
  ON_Surface **ppOVar9;
  ON_PlaneSurface *pOVar10;
  double *pdVar11;
  ON_BrepVertex *pOVar12;
  shared_ptr<const_ON_Mesh> *psVar13;
  element_type *peVar14;
  ON_3fVector *pOVar15;
  double x;
  double dVar16;
  ON_3fVector OVar17;
  undefined1 auVar18 [16];
  double local_258;
  int local_21c;
  int ncnt_2;
  int ni_2;
  ON_Mesh *pMesh_2;
  shared_ptr<const_ON_Mesh> spMesh_2;
  int local_1dc;
  int ncnt_1;
  int ni_1;
  ON_Xform tmp;
  bool bEvAnalysisMesh;
  ON_Mesh *pMesh_1;
  shared_ptr<const_ON_Mesh> spMesh_1;
  int local_118;
  int ncnt;
  int ni;
  ON_Mesh *pMesh;
  shared_ptr<const_ON_Mesh> spMesh;
  ON_Surface *srf;
  undefined1 local_e0 [7];
  bool bEvMesh;
  ON_BrepFace *local_b0;
  ON_BrepFace *face;
  ON_BrepEdge *edge;
  ON_3dPoint Q;
  ON_3dPoint P;
  int vi;
  int ui;
  ON_Interval v;
  ON_Interval u;
  ON_NurbsSurface *nurbs_srf;
  double uniform_scale;
  bool bUniformScale;
  double det;
  int is_similarity;
  int iStack_1c;
  bool rc;
  int count;
  int i;
  ON_Xform *xform_local;
  ON_Brep *this_local;
  
  det._7_1_ = true;
  (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x17])(this,1);
  iVar4 = ON_Xform::IsSimilarity(xform);
  x = ON_Xform::Determinant(xform,(double *)0x0);
  bVar3 = false;
  if (iVar4 != 0) {
    bVar3 = false;
    if ((x != 0.0) || (NAN(x))) {
      bVar2 = ON_IsValid(x);
      bVar3 = false;
      if (bVar2) {
        bVar3 = 1e-06 < ABS(ABS(x) - 1.0);
      }
    }
  }
  if (bVar3) {
    local_258 = pow(ABS(x),0.3333333333333333);
  }
  else {
    local_258 = 1.0;
  }
  if (iVar4 != 1) {
    this->m_is_solid = 0;
  }
  ON_BoundingBox::Destroy(&this->m_bbox);
  iVar5 = ON_SimpleArray<ON_Curve_*>::Count(&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>);
  for (iStack_1c = 0; iStack_1c < iVar5; iStack_1c = iStack_1c + 1) {
    ppOVar8 = ON_SimpleArray<ON_Curve_*>::operator[]
                        (&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>,iStack_1c);
    if (*ppOVar8 != (ON_Curve *)0x0) {
      ppOVar8 = ON_SimpleArray<ON_Curve_*>::operator[]
                          (&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>,iStack_1c);
      uVar6 = (*((*ppOVar8)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1c])
                        (*ppOVar8,xform);
      if ((uVar6 & 1) == 0) {
        det._7_1_ = false;
      }
    }
  }
  iVar5 = ON_SimpleArray<ON_Surface_*>::Count(&(this->m_S).super_ON_SimpleArray<ON_Surface_*>);
  auVar18._8_8_ = v.m_t[0];
  auVar18._0_8_ = _vi;
  iStack_1c = 0;
  do {
    v.m_t[0] = auVar18._8_8_;
    _vi = auVar18._0_8_;
    if (iVar5 <= iStack_1c) {
      iVar4 = ON_ClassArray<ON_BrepVertex>::Count((ON_ClassArray<ON_BrepVertex> *)&this->m_V);
      for (iStack_1c = 0; iStack_1c < iVar4; iStack_1c = iStack_1c + 1) {
        pOVar12 = ON_ClassArray<ON_BrepVertex>::operator[]
                            ((ON_ClassArray<ON_BrepVertex> *)&this->m_V,iStack_1c);
        uVar6 = (*(pOVar12->super_ON_Point).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x1c])
                          (pOVar12,xform);
        if ((uVar6 & 1) == 0) {
          det._7_1_ = false;
        }
      }
      iVar4 = ON_ClassArray<ON_BrepEdge>::Count((ON_ClassArray<ON_BrepEdge> *)&this->m_E);
      for (iStack_1c = 0; iStack_1c < iVar4; iStack_1c = iStack_1c + 1) {
        face = (ON_BrepFace *)
               ON_ClassArray<ON_BrepEdge>::operator[]
                         ((ON_ClassArray<ON_BrepEdge> *)&this->m_E,iStack_1c);
        ON_Object::TransformUserData((ON_Object *)face,xform);
        if (((0.0 < (face->m_bbox).m_min.z) && (0.0 < local_258)) &&
           ((local_258 != 1.0 || (NAN(local_258))))) {
          (face->m_bbox).m_min.z = local_258 * (face->m_bbox).m_min.z;
        }
      }
      iVar4 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&this->m_F);
      for (iStack_1c = 0; iStack_1c < iVar4; iStack_1c = iStack_1c + 1) {
        local_b0 = ON_ClassArray<ON_BrepFace>::operator[]
                             ((ON_ClassArray<ON_BrepFace> *)&this->m_F,iStack_1c);
        ON_Object::TransformUserData((ON_Object *)local_b0,xform);
        ON_BoundingBox::Destroy(&local_b0->m_bbox);
        ON_Geometry::BoundingBox((ON_BoundingBox *)local_e0,(ON_Geometry *)local_b0);
        memcpy(&local_b0->m_bbox,local_e0,0x30);
        if (local_b0->m_face_index != -1) {
          ON_BoundingBox::Union(&this->m_bbox,&local_b0->m_bbox);
        }
        bVar3 = true;
        if (1.490116119385e-08 < ABS(x)) {
          pdVar11 = ON_Xform::operator[](xform,3);
          bVar3 = true;
          if ((*pdVar11 == 0.0) && (!NAN(*pdVar11))) {
            pdVar11 = ON_Xform::operator[](xform,3);
            bVar3 = true;
            if ((pdVar11[1] == 0.0) && (!NAN(pdVar11[1]))) {
              pdVar11 = ON_Xform::operator[](xform,3);
              bVar3 = true;
              if ((pdVar11[2] == 0.0) && (!NAN(pdVar11[2]))) {
                pdVar11 = ON_Xform::operator[](xform,3);
                bVar3 = pdVar11[3] != 1.0;
              }
            }
          }
        }
        spMesh.super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ON_BrepFace::SurfaceOf(local_b0);
        if (spMesh.super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          bVar3 = false;
        }
        psVar13 = ON_BrepFace::UniqueMesh(local_b0,render_mesh);
        std::shared_ptr<const_ON_Mesh>::shared_ptr((shared_ptr<const_ON_Mesh> *)&pMesh,psVar13);
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&pMesh);
        if (bVar2) {
          peVar14 = std::__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::get
                              ((__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2> *)&pMesh);
          if ((bVar3 == false) ||
             (bVar2 = ON_Mesh::EvaluateMeshGeometry
                                (peVar14,(ON_Surface *)
                                         spMesh.
                                         super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi), !bVar2)) {
            (*(peVar14->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1c])(peVar14,xform);
          }
          else if ((local_b0->m_bRev & 1U) != 0) {
            iVar5 = ON_SimpleArray<ON_3fVector>::Count
                              (&(peVar14->m_N).super_ON_SimpleArray<ON_3fVector>);
            for (local_118 = 0; local_118 < iVar5; local_118 = local_118 + 1) {
              pOVar15 = ON_SimpleArray<ON_3fVector>::operator[]
                                  (&(peVar14->m_N).super_ON_SimpleArray<ON_3fVector>,local_118);
              OVar17 = ON_3fVector::operator-(pOVar15);
              spMesh_1.super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = OVar17._0_8_;
              pOVar15 = ON_SimpleArray<ON_3fVector>::operator[]
                                  (&(peVar14->m_N).super_ON_SimpleArray<ON_3fVector>,local_118);
              *pOVar15 = OVar17;
            }
          }
        }
        std::shared_ptr<const_ON_Mesh>::~shared_ptr((shared_ptr<const_ON_Mesh> *)&pMesh);
        psVar13 = ON_BrepFace::UniqueMesh(local_b0,analysis_mesh);
        std::shared_ptr<const_ON_Mesh>::shared_ptr((shared_ptr<const_ON_Mesh> *)&pMesh_1,psVar13);
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&pMesh_1);
        if (bVar2) {
          peVar14 = std::__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::get
                              ((__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2> *)&pMesh_1);
          tmp.m_xform[3][3]._7_1_ = bVar3;
          if (bVar3 == false) {
            tmp.m_xform[3][1] = xform->m_xform[3][2];
            tmp.m_xform[3][2] = xform->m_xform[3][3];
            tmp.m_xform[2][3] = xform->m_xform[3][0];
            tmp.m_xform[3][0] = xform->m_xform[3][1];
            tmp.m_xform[2][1] = xform->m_xform[2][2];
            tmp.m_xform[1][3] = xform->m_xform[2][0];
            tmp.m_xform[2][0] = xform->m_xform[2][1];
            _ncnt_1 = xform->m_xform[0][0];
            tmp.m_xform[0][0] = xform->m_xform[0][1];
            tmp.m_xform[0][1] = xform->m_xform[0][2];
            tmp.m_xform[0][3] = xform->m_xform[1][0];
            tmp.m_xform[1][0] = xform->m_xform[1][1];
            tmp.m_xform[1][1] = xform->m_xform[1][2];
            tmp.m_xform[0][2] = 0.0;
            tmp.m_xform[1][2] = 0.0;
            tmp.m_xform[2][2] = 0.0;
            iVar5 = ON_Xform::IsSimilarity((ON_Xform *)&ncnt_1);
            if (iVar5 != 1) {
              tmp.m_xform[3][3]._7_1_ = 1;
            }
          }
          if ((((tmp.m_xform[3][3]._7_1_ & 1) == 0) ||
              (spMesh.super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) ||
             (bVar2 = ON_Mesh::EvaluateMeshGeometry
                                (peVar14,(ON_Surface *)
                                         spMesh.
                                         super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi), !bVar2)) {
            (*(peVar14->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1c])(peVar14,xform);
          }
          else if ((local_b0->m_bRev & 1U) != 0) {
            iVar5 = ON_SimpleArray<ON_3fVector>::Count
                              (&(peVar14->m_N).super_ON_SimpleArray<ON_3fVector>);
            for (local_1dc = 0; local_1dc < iVar5; local_1dc = local_1dc + 1) {
              pOVar15 = ON_SimpleArray<ON_3fVector>::operator[]
                                  (&(peVar14->m_N).super_ON_SimpleArray<ON_3fVector>,local_1dc);
              OVar17 = ON_3fVector::operator-(pOVar15);
              spMesh_2.super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = OVar17._0_8_;
              pOVar15 = ON_SimpleArray<ON_3fVector>::operator[]
                                  (&(peVar14->m_N).super_ON_SimpleArray<ON_3fVector>,local_1dc);
              *pOVar15 = OVar17;
            }
          }
        }
        std::shared_ptr<const_ON_Mesh>::~shared_ptr((shared_ptr<const_ON_Mesh> *)&pMesh_1);
        psVar13 = ON_BrepFace::UniqueMesh(local_b0,preview_mesh);
        std::shared_ptr<const_ON_Mesh>::shared_ptr((shared_ptr<const_ON_Mesh> *)&pMesh_2,psVar13);
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&pMesh_2);
        if (bVar2) {
          peVar14 = std::__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::get
                              ((__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2> *)&pMesh_2);
          if ((bVar3 == false) ||
             (bVar3 = ON_Mesh::EvaluateMeshGeometry
                                (peVar14,(ON_Surface *)
                                         spMesh.
                                         super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi), !bVar3)) {
            (*(peVar14->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1c])(peVar14,xform);
          }
          else if ((local_b0->m_bRev & 1U) != 0) {
            iVar5 = ON_SimpleArray<ON_3fVector>::Count
                              (&(peVar14->m_N).super_ON_SimpleArray<ON_3fVector>);
            for (local_21c = 0; local_21c < iVar5; local_21c = local_21c + 1) {
              pOVar15 = ON_SimpleArray<ON_3fVector>::operator[]
                                  (&(peVar14->m_N).super_ON_SimpleArray<ON_3fVector>,local_21c);
              OVar17 = ON_3fVector::operator-(pOVar15);
              pOVar15 = ON_SimpleArray<ON_3fVector>::operator[]
                                  (&(peVar14->m_N).super_ON_SimpleArray<ON_3fVector>,local_21c);
              *pOVar15 = OVar17;
            }
          }
        }
        std::shared_ptr<const_ON_Mesh>::~shared_ptr((shared_ptr<const_ON_Mesh> *)&pMesh_2);
      }
      ON_Object::TransformUserData((ON_Object *)this,xform);
      return det._7_1_;
    }
    ppOVar9 = ON_SimpleArray<ON_Surface_*>::operator[]
                        (&(this->m_S).super_ON_SimpleArray<ON_Surface_*>,iStack_1c);
    auVar18._8_8_ = v.m_t[0];
    auVar18._0_8_ = _vi;
    if (*ppOVar9 != (ON_Surface *)0x0) {
      u.m_t[1] = 0.0;
      if (iVar4 == 0) {
        ppOVar9 = ON_SimpleArray<ON_Surface_*>::operator[]
                            (&(this->m_S).super_ON_SimpleArray<ON_Surface_*>,iStack_1c);
        iVar7 = (*((*ppOVar9)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2b])(*ppOVar9,0)
        ;
        if (iVar7 == 1) {
          ppOVar9 = ON_SimpleArray<ON_Surface_*>::operator[]
                              (&(this->m_S).super_ON_SimpleArray<ON_Surface_*>,iStack_1c);
          iVar7 = (*((*ppOVar9)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2b])
                            (*ppOVar9,1);
          if (iVar7 == 1) {
            ppOVar9 = ON_SimpleArray<ON_Surface_*>::operator[]
                                (&(this->m_S).super_ON_SimpleArray<ON_Surface_*>,iStack_1c);
            pOVar10 = ON_PlaneSurface::Cast((ON_Object *)*ppOVar9);
            if (pOVar10 != (ON_PlaneSurface *)0x0) {
              u.m_t[1] = (double)ON_NurbsSurface::New();
              ppOVar9 = ON_SimpleArray<ON_Surface_*>::operator[]
                                  (&(this->m_S).super_ON_SimpleArray<ON_Surface_*>,iStack_1c);
              iVar7 = (*((*ppOVar9)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3c])
                                (*ppOVar9,u.m_t[1]);
              if (iVar7 == 0) {
                if ((ON_NurbsSurface *)u.m_t[1] != (ON_NurbsSurface *)0x0) {
                  (*(((ON_NurbsSurface *)u.m_t[1])->super_ON_Surface).super_ON_Geometry.
                    super_ON_Object._vptr_ON_Object[4])();
                }
                u.m_t[1] = 0.0;
              }
              else {
                uVar6 = (*(((ON_NurbsSurface *)u.m_t[1])->super_ON_Surface).super_ON_Geometry.
                          super_ON_Object._vptr_ON_Object[0x1c])(u.m_t[1],xform);
                if ((uVar6 & 1) == 0) {
                  if ((ON_NurbsSurface *)u.m_t[1] != (ON_NurbsSurface *)0x0) {
                    (*(((ON_NurbsSurface *)u.m_t[1])->super_ON_Surface).super_ON_Geometry.
                      super_ON_Object._vptr_ON_Object[4])();
                  }
                  u.m_t[1] = 0.0;
                }
              }
            }
          }
        }
      }
      ppOVar9 = ON_SimpleArray<ON_Surface_*>::operator[]
                          (&(this->m_S).super_ON_SimpleArray<ON_Surface_*>,iStack_1c);
      uVar6 = (*((*ppOVar9)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1c])
                        (*ppOVar9,xform);
      auVar18._8_8_ = v.m_t[0];
      auVar18._0_8_ = _vi;
      auVar1._8_8_ = v.m_t[0];
      auVar1._0_8_ = _vi;
      if ((uVar6 & 1) == 0) {
        if (u.m_t[1] == 0.0) {
          det._7_1_ = false;
        }
        else {
          ON_BrepTransformSwapSrfHelper(this,(ON_NurbsSurface *)u.m_t[1],iStack_1c);
          auVar18._8_8_ = v.m_t[0];
          auVar18._0_8_ = _vi;
        }
      }
      else {
        auVar18 = auVar1;
        if (u.m_t[1] != 0.0) {
          v.m_t[1] = (double)(**(code **)(*(long *)u.m_t[1] + 0x130))(u.m_t[1],0);
          auVar18 = (**(code **)(*(long *)u.m_t[1] + 0x130))(u.m_t[1],1);
          P.z._4_4_ = 0;
          while( true ) {
            v.m_t[0] = auVar18._8_8_;
            _vi = auVar18._0_8_;
            if (1 < P.z._4_4_ || u.m_t[1] == 0.0) break;
            P.z._0_4_ = 0;
            while( true ) {
              v.m_t[0] = auVar18._8_8_;
              _vi = auVar18._0_8_;
              if (1 < P.z._0_4_ || u.m_t[1] == 0.0) break;
              pdVar11 = ON_Interval::operator[]((ON_Interval *)(v.m_t + 1),P.z._4_4_);
              dVar16 = *pdVar11;
              pdVar11 = ON_Interval::operator[]((ON_Interval *)&vi,P.z._0_4_);
              ON_Surface::PointAt((ON_3dPoint *)&Q.z,(ON_Surface *)u.m_t[1],dVar16,*pdVar11);
              ppOVar9 = ON_SimpleArray<ON_Surface_*>::operator[]
                                  (&(this->m_S).super_ON_SimpleArray<ON_Surface_*>,iStack_1c);
              this_00 = *ppOVar9;
              pdVar11 = ON_Interval::operator[]((ON_Interval *)(v.m_t + 1),P.z._4_4_);
              dVar16 = *pdVar11;
              pdVar11 = ON_Interval::operator[]((ON_Interval *)&vi,P.z._0_4_);
              ON_Surface::PointAt((ON_3dPoint *)&edge,this_00,dVar16,*pdVar11);
              dVar16 = ON_3dPoint::DistanceTo((ON_3dPoint *)&Q.z,(ON_3dPoint *)&edge);
              auVar18._8_8_ = v.m_t[0];
              auVar18._0_8_ = _vi;
              if (2.3283064365386963e-10 < dVar16) {
                ON_BrepTransformSwapSrfHelper(this,(ON_NurbsSurface *)u.m_t[1],iStack_1c);
                auVar18._8_8_ = v.m_t[0];
                auVar18._0_8_ = _vi;
                u.m_t[1] = 0.0;
                break;
              }
              P.z._0_4_ = P.z._0_4_ + 1;
            }
            P.z._4_4_ = P.z._4_4_ + 1;
          }
          if ((u.m_t[1] != 0.0) && (u.m_t[1] != 0.0)) {
            (**(code **)(*(long *)u.m_t[1] + 0x20))();
            auVar18._8_8_ = v.m_t[0];
            auVar18._0_8_ = _vi;
          }
        }
      }
    }
    iStack_1c = iStack_1c + 1;
  } while( true );
}

Assistant:

bool ON_Brep::Transform( const ON_Xform& xform )
{
  int i, count;
  bool rc = true;
  
  DestroyRuntimeCache();

  int is_similarity = xform.IsSimilarity();
  const double det = xform.Determinant();
  bool bUniformScale = (0 != is_similarity && det != 0.0 && ON_IsValid(det) && fabs(fabs(det) - 1.0) > 1.0e-6);
  const double uniform_scale = bUniformScale ? pow(fabs(det), 1.0 / 3.0) : 1.0;

  if ( 1 != is_similarity )
  {
    // this will cause the solid flag to be
    // recaclulated the next time it is needed.
    m_is_solid = 0;
  }


  // 13 Feb 2003 Dale Lear:
  // Transforming the bbox makes it grow too large under repeated
  // rotations.  So, we will destroy it here and reset it below.
  //m_bbox.Transform(xform);
  m_bbox.Destroy();

  count = m_C3.Count();
  for ( i = 0; i < count; i++ ) 
  {
    if ( m_C3[i] ) 
    {
      if ( !m_C3[i]->Transform(xform) )
        rc = false;
    }
  }

  count = m_S.Count();
  for ( i = 0; i < count; i++ ) {
    if ( m_S[i] ) 
    
    {
      ON_NurbsSurface* nurbs_srf = 0;
      if ( !is_similarity )
      {
        if (    1 == m_S[i]->Degree(0) // degree tests reduce calls to
             && 1 == m_S[i]->Degree(1) // slow ON_PlaneSurface::Cast()
             && 0 != ON_PlaneSurface::Cast(m_S[i]) )
        {
          nurbs_srf = ON_NurbsSurface::New();
          if ( !m_S[i]->GetNurbForm(*nurbs_srf) )
          {
            delete nurbs_srf;
            nurbs_srf = 0;
          }
          else if ( !nurbs_srf->Transform(xform) )
          {
            delete nurbs_srf;
            nurbs_srf = 0;
          }
        }
      }

      if ( !m_S[i]->Transform(xform) )
      {
        if ( nurbs_srf )
        {
          ON_BrepTransformSwapSrfHelper(*this,nurbs_srf,i);
          nurbs_srf = 0;
        }
        else
        {
          rc = false;
        }
      }
      else if ( nurbs_srf )
      {
        // make sure transformation was good
        ON_Interval u = nurbs_srf->Domain(0);
        ON_Interval v = nurbs_srf->Domain(1);
        for ( int ui = 0; ui < 2 && nurbs_srf; ui++ ) for (int vi = 0; vi < 2 && nurbs_srf; vi++)
        {
          ON_3dPoint P = nurbs_srf->PointAt(u[ui],v[vi]);
          ON_3dPoint Q = m_S[i]->PointAt(u[ui],v[vi]);
          if ( P.DistanceTo(Q) > ON_ZERO_TOLERANCE )
          {
            ON_BrepTransformSwapSrfHelper(*this,nurbs_srf,i);
            nurbs_srf = 0;
            break;
          }
        }
        if ( nurbs_srf )
        {
          delete nurbs_srf;
          nurbs_srf = 0;
        }
      }
    }
  }

  count = m_V.Count();
  for ( i = 0; i < count; i++ ) {
    if ( !m_V[i].Transform(xform) )
      rc = false;
  }

  count = m_E.Count();
  for ( i = 0; i < count; i++ ) {
    ON_BrepEdge& edge = m_E[i];
    edge.TransformUserData(xform);
    // 2014-05-13 Dale Lear RH-26852
    //   Based on a conversation with Chuck, we will
    //   test scaling edge tolerances.  The bug
    //   bailed down to a unit system change from a 
    //   "long" unit to mm made a valid brep invalid
    //   because the edge tolerances were too small.
    //   This fix does ot handle non-uniform scaling.
    //   In the case of a non-uniform scale, the edge
    //   tolerance should be recalculated.
    if (edge.m_tolerance > 0.0 && uniform_scale > 0.0 && uniform_scale != 1.0)
    {
      edge.m_tolerance *= uniform_scale;
    }
  }

  count = m_F.Count();
  for ( i = 0; i < count; i++ ) 
  {
    ON_BrepFace& face = m_F[i];
    face.TransformUserData(xform);

    // 13 Feb 2003 Dale Lear:
    // Transforming the bbox makes it grow too large under repeated
    // rotations.  So, we need to reset it.
    face.m_bbox.Destroy();

    //GBA 20 May 2020. Brep box now computed from face boxes, instead of surface boxes.
    face.m_bbox = face.BoundingBox();    
    if ( face.m_face_index != -1 )
      m_bbox.Union( face.m_bbox );
    

    // 12 May 2003 Dale Lear - RR 10528
    //     Use surface evaluation to update rendermesh when 
    //     calling ON_Mesh::Transform() will map mesh normals
    //     to some thing different that the "true" surface
    //     normal.
    bool bEvMesh = ( fabs(det) <= ON_SQRT_EPSILON
                     || xform[3][0] != 0.0
                     || xform[3][1] != 0.0
                     || xform[3][2] != 0.0
                     || xform[3][3] != 1.0
                     );
    const ON_Surface* srf = face.SurfaceOf();

    if ( 0 == srf )
      bEvMesh = false;

    //Render meshes
    {
      auto spMesh = face.UniqueMesh(ON::render_mesh);
      if (spMesh)
      {
        auto pMesh = const_cast<ON_Mesh*>(spMesh.get());

        if ( bEvMesh && pMesh->EvaluateMeshGeometry(*srf) )
        {
          if ( face.m_bRev )
          {
            // 29 September 2003 Dale Lear
            //     Normals on render meshes (and face orientations)
            //     take face.m_bRev into account so that two sided
            //     materials work as expected.  EvaluateMeshGeometry()
            //     does not take face.m_bRev into account, so we need
            //     to reverse the face normals here.
            int ni, ncnt = pMesh->m_N.Count();
            for ( ni = 0; ni < ncnt; ni++ )
            {
              pMesh->m_N[ni] = -(pMesh->m_N[ni]);
            }
          }
        }
        else
        {
          pMesh->Transform(xform);
        }
      }
    }

    //Analysis meshes
    {
      auto spMesh = face.UniqueMesh(ON::analysis_mesh);
      if (spMesh)
      {
        auto pMesh = const_cast<ON_Mesh*>(spMesh.get());

        // Dale Lear 30 March 2009 - bug 46766
        //   Evaluate analysis meshes when the transform involves scaling
        //   so curvature values are properly updated.
        bool bEvAnalysisMesh = bEvMesh;
        if ( !bEvAnalysisMesh )
        {
          ON_Xform tmp(xform);
          tmp.m_xform[0][3] = 0.0;
          tmp.m_xform[1][3] = 0.0;
          tmp.m_xform[2][3] = 0.0;
          if ( 1 != tmp.IsSimilarity() )
            bEvAnalysisMesh = true;
        }
        // 1 Sept 2021, Mikko, RH-65468:
        // Added null check to prevent a crash.
        if ( bEvAnalysisMesh && nullptr != srf && pMesh->EvaluateMeshGeometry(*srf) )
        {
          // 28 Sept 2012, Mikko:
          // Apply the "29 September 2003 Dale Lear" fix above also to analysis meshes.
          if ( face.m_bRev )
          {
            int ni, ncnt = pMesh->m_N.Count();
            for ( ni = 0; ni < ncnt; ni++ )
            {
              pMesh->m_N[ni] = -(pMesh->m_N[ni]);
            }
          }
        }
        else
        {
          pMesh->Transform(xform);
        }
      }
    }

    //Preview meshes
    {
      auto spMesh = face.UniqueMesh(ON::preview_mesh);
      if (spMesh)
      {
        auto pMesh = const_cast<ON_Mesh*>(spMesh.get());
        if ( bEvMesh && pMesh->EvaluateMeshGeometry(*srf) )
        {
          if ( face.m_bRev )
          {
            // 10 June 2021, Mikko, RH-64582:
            // Fixed typo that caused a crash, changed "m_analysis_mesh" to "m_preview_mesh".
            int ni, ncnt = pMesh->m_N.Count();
            for ( ni = 0; ni < ncnt; ni++ )
            {
              pMesh->m_N[ni] = -(pMesh->m_N[ni]);
            }
          }
        }
        else
        {
          pMesh->Transform(xform);
        }
      }
    }
  }

  // The call to transform user data needs to be last
  // so that the rest of the brep is in position.
  // In particular, ON_BrepRegionTopologyUserData::Transform
  // assumes the face bounding boxes are up to date.
  TransformUserData(xform);

  return rc;
}